

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O2

void CSOAA::do_actual_learning_wap(ldf *data,single_learner *base,multi_ex *ec_seq)

{
  pointer ppeVar1;
  example *ec;
  wclass *pwVar2;
  example *ec_00;
  wclass *pwVar3;
  uint64_t uVar4;
  ulong uVar5;
  iterator __begin1;
  pointer ppeVar6;
  ulong uVar7;
  iterator __end1;
  float fVar8;
  ulong local_c0;
  multi_ex *__range1;
  label_t local_a8;
  label_t lStack_a0;
  label_t local_98;
  label_t *local_90;
  ulong local_88;
  single_learner *local_80;
  vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_> all_costs;
  _Vector_base<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_> local_60;
  undefined1 local_48 [16];
  
  ppeVar6 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppeVar1 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  uVar5 = (long)ppeVar1 - (long)ppeVar6 >> 3;
  all_costs.super__Vector_base<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  all_costs.super__Vector_base<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  all_costs.super__Vector_base<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80 = base;
  for (; ppeVar6 != ppeVar1; ppeVar6 = ppeVar6 + 1) {
    local_a8 = ((*ppeVar6)->l).multi;
    std::vector<COST_SENSITIVE::wclass*,std::allocator<COST_SENSITIVE::wclass*>>::
    emplace_back<COST_SENSITIVE::wclass*>
              ((vector<COST_SENSITIVE::wclass*,std::allocator<COST_SENSITIVE::wclass*>> *)&all_costs
               ,(wclass **)&local_a8);
  }
  std::vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>::vector
            ((vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_> *)
             &local_60,&all_costs);
  compute_wap_values((vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_> *)
                     &local_60);
  std::_Vector_base<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>::
  ~_Vector_base(&local_60);
  local_c0 = 1;
  uVar7 = 0;
  while (uVar7 != uVar5) {
    ec = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
         super__Vector_impl_data._M_start[uVar7];
    pwVar2 = (ec->l).cs.costs._begin;
    local_98 = (label_t)(ec->l).cs.costs.erase_count;
    local_a8 = (label_t)(ec->l).cs.costs._end;
    lStack_a0 = (label_t)(ec->l).cs.costs.end_array;
    local_88 = uVar7;
    if ((ulong)pwVar2->class_index != 0xffffffff) {
      LabelDict::add_example_namespace_from_memory
                (&data->label_features,ec,(ulong)pwVar2->class_index);
      local_90 = (label_t *)&(ec->l).cs.costs._end;
      for (uVar7 = local_c0; uVar7 < uVar5; uVar7 = uVar7 + 1) {
        ec_00 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar7];
        pwVar3 = (ec_00->l).cs.costs._begin;
        if (((ulong)pwVar3->class_index != 0xffffffff) &&
           (fVar8 = ABS(pwVar3->wap_value - pwVar2->wap_value), local_48 = ZEXT416((uint)fVar8),
           1e-06 <= fVar8)) {
          LabelDict::add_example_namespace_from_memory
                    (&data->label_features,ec_00,(ulong)pwVar3->class_index);
          (ec->l).simple.initial = 0.0;
          (ec->l).simple.label =
               *(float *)(&DAT_00243360 +
                         (ulong)(pwVar2->x <= pwVar3->x && pwVar3->x != pwVar2->x) * 4);
          fVar8 = ec->weight;
          ec->weight = (float)local_48._0_4_;
          ec->partial_prediction = 0.0;
          subtract_example(data->all,ec,ec_00);
          uVar4 = (ec->super_example_predict).ft_offset;
          (ec->super_example_predict).ft_offset = data->ft_offset;
          LEARNER::learner<char,_example>::learn(local_80,ec,0);
          (ec->super_example_predict).ft_offset = uVar4;
          ec->weight = fVar8;
          unsubtract_example(ec);
          LabelDict::del_example_namespace_from_memory
                    (&data->label_features,ec_00,(ulong)pwVar3->class_index);
        }
      }
      LabelDict::del_example_namespace_from_memory
                (&data->label_features,ec,(ulong)pwVar2->class_index);
      (ec->l).cs.costs._begin = pwVar2;
      local_90[2] = local_98;
      *local_90 = local_a8;
      local_90[1] = lStack_a0;
    }
    local_c0 = local_c0 + 1;
    uVar7 = local_88 + 1;
  }
  std::_Vector_base<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>::
  ~_Vector_base(&all_costs.
                 super__Vector_base<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>
               );
  return;
}

Assistant:

void do_actual_learning_wap(ldf& data, single_learner& base, multi_ex& ec_seq)
{
  size_t K = ec_seq.size();
  vector<COST_SENSITIVE::wclass*> all_costs;
  for (const auto & example : ec_seq) all_costs.push_back(&example->l.cs.costs[0]);
  compute_wap_values(all_costs);

  for (size_t k1 = 0; k1 < K; k1++)
  {
    example* ec1 = ec_seq[k1];

    // save original variables
    COST_SENSITIVE::label save_cs_label = ec1->l.cs;
    label_data& simple_label = ec1->l.simple;

    v_array<COST_SENSITIVE::wclass> costs1 = save_cs_label.costs;
    if (costs1[0].class_index == (uint32_t)-1)
      continue;

    LabelDict::add_example_namespace_from_memory(data.label_features, *ec1, costs1[0].class_index);

    for (size_t k2 = k1 + 1; k2 < K; k2++)
    {
      example* ec2 = ec_seq[k2];
      v_array<COST_SENSITIVE::wclass> costs2 = ec2->l.cs.costs;

      if (costs2[0].class_index == (uint32_t)-1)
        continue;
      float value_diff = fabs(costs2[0].wap_value - costs1[0].wap_value);
      // float value_diff = fabs(costs2[0].x - costs1[0].x);
      if (value_diff < 1e-6)
        continue;

      LabelDict::add_example_namespace_from_memory(data.label_features, *ec2, costs2[0].class_index);

      // learn
      simple_label.initial = 0.;
      simple_label.label = (costs1[0].x < costs2[0].x) ? -1.0f : 1.0f;
      float old_weight = ec1->weight;
      ec1->weight = value_diff;
      ec1->partial_prediction = 0.;
      subtract_example(*data.all, ec1, ec2);
      uint64_t old_offset = ec1->ft_offset;
      ec1->ft_offset = data.ft_offset;
      base.learn(*ec1);
      ec1->ft_offset = old_offset;
      ec1->weight = old_weight;
      unsubtract_example(ec1);

      LabelDict::del_example_namespace_from_memory(data.label_features, *ec2, costs2[0].class_index);
    }
    LabelDict::del_example_namespace_from_memory(data.label_features, *ec1, costs1[0].class_index);

    // restore original cost-sensitive label, sum of importance weights
    ec1->l.cs = save_cs_label;
    // TODO: What about partial_prediction? See do_actual_learning_oaa.
  }
}